

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_const_context_t_conflict p_Var3;
  exr_coding_channel_info_t *peVar4;
  exr_result_t eVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint64_t dataoffset;
  
  p_Var3 = decode->context;
  if (p_Var3 == (exr_const_context_t_conflict)0x0) {
    eVar5 = 2;
  }
  else {
    if (p_Var3->mode != '\0') {
      eVar5 = (*p_Var3->standard_error)(p_Var3,7);
      return eVar5;
    }
    uVar1 = decode->part_index;
    if (((int)uVar1 < 0) || (p_Var3->num_parts <= (int)uVar1)) {
      eVar5 = (*p_Var3->print_error)
                        (p_Var3,4,"Part index (%d) out of range",(ulong)uVar1,p_Var3->print_error);
      return eVar5;
    }
    dataoffset = (decode->chunk).data_offset;
    iVar2 = (decode->chunk).start_y;
    uVar1 = (decode->chunk).height;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
      lVar10 = 0x28;
      for (lVar8 = 0; lVar8 < decode->channel_count; lVar8 = lVar8 + 1) {
        peVar4 = decode->channels;
        if (*(int *)((long)peVar4 + lVar10 + -0x20) != 0) {
          uVar1 = *(uint *)((long)peVar4 + lVar10 + -0x14);
          if ((int)uVar1 < 2) {
            lVar7 = (long)*(int *)((long)peVar4 + lVar10 + -4) * uVar9;
          }
          else {
            if ((iVar2 + (int)uVar9) % (int)uVar1 != 0) goto LAB_00127526;
            lVar7 = (long)*(int *)((long)peVar4 + lVar10 + -4) *
                    ((uVar9 & 0xffffffff) / (ulong)uVar1);
          }
          eVar5 = (*p_Var3->do_read)(p_Var3,(void *)(*(long *)((long)&peVar4->channel_name + lVar10)
                                                    + lVar7),
                                     (long)*(char *)((long)peVar4 + lVar10 + -0xf) *
                                     (long)*(int *)((long)peVar4 + lVar10 + -0x1c),&dataoffset,
                                     (int64_t *)0x0,EXR_MUST_READ_ALL);
          if (eVar5 != 0) {
            return eVar5;
          }
        }
LAB_00127526:
        lVar10 = lVar10 + 0x30;
      }
    }
    eVar5 = 0;
  }
  return eVar5;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t        rv;
    int                 height, start_y;
    uint64_t            dataoffset, toread;
    uint8_t*            cdata;
    exr_const_context_t ctxt = decode->context;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (ctxt->mode != EXR_CONTEXT_READ)
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_READ);
    if (decode->part_index < 0 || decode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else { cdata += (uint64_t) y * (uint64_t) decc->user_line_stride; }

            /* actual read into the output pointer */
            rv = ctxt->do_read (
                ctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}